

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O3

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,
                         XrBindingModificationsKHR *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  XrInteractionProfileDpadBindingEXT *value_00;
  char cVar2;
  char cVar3;
  NextChainResult NVar4;
  XrResult XVar5;
  uint uVar6;
  ulong uVar7;
  uint __val;
  string local_190;
  string error_message;
  vector<XrStructureType,_std::allocator<XrStructureType>_> duplicate_ext_structs;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_130;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_118;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_100;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_e8;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_d0;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_b8;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_a0;
  string local_88;
  vector<XrStructureType,_std::allocator<XrStructureType>_> encountered_structs;
  vector<XrStructureType,_std::allocator<XrStructureType>_> valid_ext_structs;
  
  XVar5 = XR_SUCCESS;
  if (value->type != XR_TYPE_BINDING_MODIFICATIONS_KHR) {
    InvalidStructureType
              (instance_info,command_name,objects_info,"XrBindingModificationsKHR",value->type,
               "VUID-XrBindingModificationsKHR-type-type",XR_TYPE_BINDING_MODIFICATIONS_KHR,
               "XR_TYPE_BINDING_MODIFICATIONS_KHR");
    XVar5 = XR_ERROR_VALIDATION_FAILURE;
  }
  if (check_pnext) {
    valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    NVar4 = ValidateNextChain(instance_info,command_name,objects_info,value->next,&valid_ext_structs
                              ,&encountered_structs,&duplicate_ext_structs);
    if (NVar4 == NEXT_CHAIN_RESULT_DUPLICATE_STRUCT) {
      error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&error_message,
                 "Multiple structures of the same type(s) in \"next\" chain for ","");
      std::__cxx11::string::append((char *)&error_message);
      StructTypesToString_abi_cxx11_(&local_190,instance_info,&duplicate_ext_structs);
      std::__cxx11::string::_M_append((char *)&error_message,(ulong)local_190._M_dataplus._M_p);
      paVar1 = &local_190.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != paVar1) {
        operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
      }
      local_190._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_190,"VUID-XrBindingModificationsKHR-next-unique","");
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_b8,objects_info);
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_88,
                 "Multiple structures of the same type(s) in \"next\" chain for XrBindingModificationsKHR struct"
                 ,"");
      CoreValidLogMessage(instance_info,&local_190,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                          &local_b8,&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      if (local_b8.
          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b8.
                        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_b8.
                              super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_b8.
                              super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != paVar1) {
        operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)error_message._M_dataplus._M_p != &error_message.field_2) {
LAB_00184040:
        operator_delete(error_message._M_dataplus._M_p,
                        error_message.field_2._M_allocated_capacity + 1);
      }
LAB_0018404d:
      XVar5 = XR_ERROR_VALIDATION_FAILURE;
    }
    else if (NVar4 == NEXT_CHAIN_RESULT_ERROR) {
      error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&error_message,"VUID-XrBindingModificationsKHR-next-next","");
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_a0,objects_info);
      local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_190,
                 "Invalid structure(s) in \"next\" chain for XrBindingModificationsKHR struct \"next\""
                 ,"");
      CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name
                          ,&local_a0,&local_190);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2) {
        operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
      }
      if (local_a0.
          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a0.
                        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_a0.
                              super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_a0.
                              super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)error_message._M_dataplus._M_p != &error_message.field_2) goto LAB_00184040;
      goto LAB_0018404d;
    }
    if (duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(duplicate_ext_structs.
                      super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)duplicate_ext_structs.
                            super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)duplicate_ext_structs.
                            super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (!check_members || XVar5 != XR_SUCCESS) {
    return XVar5;
  }
  if (value->bindingModificationCount == 0) {
    return XR_SUCCESS;
  }
  if (value->bindingModifications != (XrBindingModificationBaseHeaderKHR **)0x0) {
    uVar7 = 0;
    do {
      value_00 = (XrInteractionProfileDpadBindingEXT *)value->bindingModifications[uVar7];
      __val = (uint)uVar7;
      if (value_00 == (XrInteractionProfileDpadBindingEXT *)0x0) {
        error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&error_message,
                   "Structure XrBindingModificationsKHR member bindingModifications","");
        std::__cxx11::string::append((char *)&error_message);
        cVar3 = '\x01';
        if (__val < 10) goto LAB_001845da;
        cVar2 = '\x04';
        goto LAB_001843b4;
      }
      if (value_00->type == XR_TYPE_INTERACTION_PROFILE_ANALOG_THRESHOLD_VALVE) {
        XVar5 = ValidateXrStruct(instance_info,command_name,objects_info,true,true,
                                 (XrInteractionProfileAnalogThresholdVALVE *)value_00);
        if (XVar5 != XR_SUCCESS) {
          error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&error_message,
                     "Structure XrBindingModificationsKHR member bindingModifications","");
          std::__cxx11::string::append((char *)&error_message);
          cVar3 = '\x01';
          if (__val < 10) goto LAB_001847af;
          cVar2 = '\x04';
          goto LAB_00184593;
        }
      }
      else if (value_00->type == XR_TYPE_INTERACTION_PROFILE_DPAD_BINDING_EXT) {
        XVar5 = ValidateXrStruct(instance_info,command_name,objects_info,true,true,value_00);
        if (XVar5 != XR_SUCCESS) {
          error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&error_message,
                     "Structure XrBindingModificationsKHR member bindingModifications","");
          std::__cxx11::string::append((char *)&error_message);
          cVar3 = '\x01';
          if (__val < 10) goto LAB_001846cb;
          cVar2 = '\x04';
          goto LAB_00184443;
        }
      }
      else {
        XVar5 = ValidateXrStruct(instance_info,command_name,objects_info,true,false,
                                 (XrBindingModificationBaseHeaderKHR *)value_00);
        if (XVar5 != XR_SUCCESS) {
          error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&error_message,
                     "VUID-XrBindingModificationsKHR-bindingModifications-parameter","");
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                    (&local_130,objects_info);
          local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_190,
                     "Structure XrBindingModificationsKHR member bindingModifications is invalid",""
                    );
          CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                              command_name,&local_130,&local_190);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_190._M_dataplus._M_p != &local_190.field_2) {
            operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
          }
          if (local_130.
              super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_130.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_130.
                                  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_130.
                                  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)error_message._M_dataplus._M_p != &error_message.field_2) {
            operator_delete(error_message._M_dataplus._M_p,
                            error_message.field_2._M_allocated_capacity + 1);
            return XVar5;
          }
          return XVar5;
        }
      }
      uVar7 = uVar7 + 1;
      if (value->bindingModificationCount <= (uint)uVar7) {
        return XR_SUCCESS;
      }
    } while( true );
  }
  error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&error_message,
             "VUID-XrBindingModificationsKHR-bindingModifications-parameter","");
  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
            (&local_d0,objects_info);
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_190,
             "Structure XrBindingModificationsKHR member bindingModificationCount is NULL, but value->bindingModificationCount is greater than 0"
             ,"");
  CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                      &local_d0,&local_190);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  if (local_d0.
      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.
                    super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_d0.
                          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.
                          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)error_message._M_dataplus._M_p == &error_message.field_2) {
    return XR_ERROR_VALIDATION_FAILURE;
  }
  goto LAB_0018433f;
  while( true ) {
    if (uVar6 < 10000) goto LAB_001845da;
    uVar7 = (uVar7 & 0xffffffff) / 10000;
    cVar2 = cVar3 + '\x04';
    if (uVar6 < 100000) break;
LAB_001843b4:
    cVar3 = cVar2;
    uVar6 = (uint)uVar7;
    if (uVar6 < 100) {
      cVar3 = cVar3 + -2;
      goto LAB_001845da;
    }
    if (uVar6 < 1000) {
      cVar3 = cVar3 + -1;
      goto LAB_001845da;
    }
  }
  cVar3 = cVar3 + '\x01';
LAB_001845da:
  paVar1 = &local_190.field_2;
  local_190._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&local_190,cVar3);
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_190._M_dataplus._M_p,(uint)local_190._M_string_length,__val);
  std::__cxx11::string::_M_append((char *)&error_message,(ulong)local_190._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != paVar1) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)&error_message);
  std::__cxx11::string::append((char *)&error_message);
  local_190._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_190,"VUID-XrBindingModificationsKHR-bindingModifications-parameter",""
            );
  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
            (&local_e8,objects_info);
  CoreValidLogMessage(instance_info,&local_190,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                      &local_e8,&error_message);
  local_100.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_e8.
       super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_100.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_e8.
       super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  goto joined_r0x001846a9;
  while( true ) {
    if (uVar6 < 10000) goto LAB_001847af;
    uVar7 = (uVar7 & 0xffffffff) / 10000;
    cVar2 = cVar3 + '\x04';
    if (uVar6 < 100000) break;
LAB_00184593:
    cVar3 = cVar2;
    uVar6 = (uint)uVar7;
    if (uVar6 < 100) {
      cVar3 = cVar3 + -2;
      goto LAB_001847af;
    }
    if (uVar6 < 1000) {
      cVar3 = cVar3 + -1;
      goto LAB_001847af;
    }
  }
  cVar3 = cVar3 + '\x01';
LAB_001847af:
  paVar1 = &local_190.field_2;
  local_190._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&local_190,cVar3);
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_190._M_dataplus._M_p,(uint)local_190._M_string_length,__val);
  std::__cxx11::string::_M_append((char *)&error_message,(ulong)local_190._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != paVar1) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)&error_message);
  std::__cxx11::string::append((char *)&error_message);
  local_190._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_190,"VUID-XrBindingModificationsKHR-bindingModifications-parameter",""
            );
  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
            (&local_118,objects_info);
  CoreValidLogMessage(instance_info,&local_190,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                      &local_118,&error_message);
  local_100.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_118.
       super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_100.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_118.
       super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  goto joined_r0x001846a9;
  while( true ) {
    if (uVar6 < 10000) goto LAB_001846cb;
    uVar7 = (uVar7 & 0xffffffff) / 10000;
    cVar2 = cVar3 + '\x04';
    if (uVar6 < 100000) break;
LAB_00184443:
    cVar3 = cVar2;
    uVar6 = (uint)uVar7;
    if (uVar6 < 100) {
      cVar3 = cVar3 + -2;
      goto LAB_001846cb;
    }
    if (uVar6 < 1000) {
      cVar3 = cVar3 + -1;
      goto LAB_001846cb;
    }
  }
  cVar3 = cVar3 + '\x01';
LAB_001846cb:
  paVar1 = &local_190.field_2;
  local_190._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&local_190,cVar3);
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_190._M_dataplus._M_p,(uint)local_190._M_string_length,__val);
  std::__cxx11::string::_M_append((char *)&error_message,(ulong)local_190._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != paVar1) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)&error_message);
  std::__cxx11::string::append((char *)&error_message);
  local_190._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_190,"VUID-XrBindingModificationsKHR-bindingModifications-parameter",""
            );
  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
            (&local_100,objects_info);
  CoreValidLogMessage(instance_info,&local_190,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                      &local_100,&error_message);
joined_r0x001846a9:
  if (local_100.
      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_100.
                    super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_100.
                          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_100.
                          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)error_message._M_dataplus._M_p != &error_message.field_2) {
LAB_0018433f:
    operator_delete(error_message._M_dataplus._M_p,error_message.field_2._M_allocated_capacity + 1);
  }
  return XR_ERROR_VALIDATION_FAILURE;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrBindingModificationsKHR* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // Make sure the structure type is correct
    if (value->type != XR_TYPE_BINDING_MODIFICATIONS_KHR) {
        InvalidStructureType(instance_info, command_name, objects_info, "XrBindingModificationsKHR",
                             value->type, "VUID-XrBindingModificationsKHR-type-type", XR_TYPE_BINDING_MODIFICATIONS_KHR, "XR_TYPE_BINDING_MODIFICATIONS_KHR");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    if (check_pnext) {
        std::vector<XrStructureType> valid_ext_structs;
        std::vector<XrStructureType> duplicate_ext_structs;
        std::vector<XrStructureType> encountered_structs;
        NextChainResult next_result = ValidateNextChain(instance_info, command_name, objects_info,
                                                         value->next, valid_ext_structs,
                                                         encountered_structs,
                                                         duplicate_ext_structs);
        // No valid extension structs for this 'next'.  Therefore, must be NULL
        // or only contain a list of valid extension structures.
        if (NEXT_CHAIN_RESULT_ERROR == next_result) {
            CoreValidLogMessage(instance_info, "VUID-XrBindingModificationsKHR-next-next",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, "Invalid structure(s) in \"next\" chain for XrBindingModificationsKHR struct \"next\"");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        } else if (NEXT_CHAIN_RESULT_DUPLICATE_STRUCT == next_result) {
            std::string error_message = "Multiple structures of the same type(s) in \"next\" chain for ";
            error_message += "XrBindingModificationsKHR : ";
            error_message += StructTypesToString(instance_info, duplicate_ext_structs);
            CoreValidLogMessage(instance_info, "VUID-XrBindingModificationsKHR-next-unique",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info,
            "Multiple structures of the same type(s) in \"next\" chain for XrBindingModificationsKHR struct");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        }
    }
    // If we are not to check the rest of the members, just return here.
    if (!check_members || XR_SUCCESS != xr_result) {
        return xr_result;
    }
    // Optional array must be non-NULL when value->bindingModificationCount is non-zero
    if (0 != value->bindingModificationCount && nullptr == value->bindingModifications) {
        CoreValidLogMessage(instance_info, "VUID-XrBindingModificationsKHR-bindingModifications-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info,
                            "Structure XrBindingModificationsKHR member bindingModificationCount is NULL, but value->bindingModificationCount is greater than 0");
        return XR_ERROR_VALIDATION_FAILURE;
    }
    if (value->bindingModifications) {
        for (uint32_t value_bindingmodifications_inc = 0; value_bindingmodifications_inc < value->bindingModificationCount; ++value_bindingmodifications_inc) {
            if (value->bindingModifications[value_bindingmodifications_inc] == nullptr) {
                std::string error_message = "Structure XrBindingModificationsKHR member bindingModifications";
                error_message += "[";
                error_message += std::to_string(value_bindingmodifications_inc);
                error_message += "]";
                error_message += " is null";
                CoreValidLogMessage(instance_info, "VUID-XrBindingModificationsKHR-bindingModifications-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info,
                                    error_message);
                return XR_ERROR_VALIDATION_FAILURE;
            }
            // Validate if XrBindingModificationBaseHeaderKHR is a child structure of type XrInteractionProfileDpadBindingEXT and it is valid
            {
                if (value->bindingModifications != nullptr) {
                    const XrInteractionProfileDpadBindingEXT* const* new_interactionprofiledpadbindingext_value = reinterpret_cast<const XrInteractionProfileDpadBindingEXT* const*>(value->bindingModifications);
                    if (new_interactionprofiledpadbindingext_value[value_bindingmodifications_inc]->type == XR_TYPE_INTERACTION_PROFILE_DPAD_BINDING_EXT) {
                        if (nullptr != new_interactionprofiledpadbindingext_value) {
                            xr_result = ValidateXrStruct(instance_info, command_name,
                                                                            objects_info, check_members, true, new_interactionprofiledpadbindingext_value[value_bindingmodifications_inc]);
                            if (XR_SUCCESS != xr_result) {
                                std::string error_message = "Structure XrBindingModificationsKHR member bindingModifications";
                                error_message += "[";
                                error_message += std::to_string(value_bindingmodifications_inc);
                                error_message += "]";
                                error_message += " is invalid";
                                CoreValidLogMessage(instance_info, "VUID-XrBindingModificationsKHR-bindingModifications-parameter",
                                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                                    objects_info,
                                                    error_message);
                                return XR_ERROR_VALIDATION_FAILURE;
                                break;
                            } else {
                                continue;
                                }
                            }
                    }
                }
            }
            // Validate if XrBindingModificationBaseHeaderKHR is a child structure of type XrInteractionProfileAnalogThresholdVALVE and it is valid
            {
                if (value->bindingModifications != nullptr) {
                    const XrInteractionProfileAnalogThresholdVALVE* const* new_interactionprofileanalogthresholdvalve_value = reinterpret_cast<const XrInteractionProfileAnalogThresholdVALVE* const*>(value->bindingModifications);
                    if (new_interactionprofileanalogthresholdvalve_value[value_bindingmodifications_inc]->type == XR_TYPE_INTERACTION_PROFILE_ANALOG_THRESHOLD_VALVE) {
                        if (nullptr != new_interactionprofileanalogthresholdvalve_value) {
                            xr_result = ValidateXrStruct(instance_info, command_name,
                                                                            objects_info, check_members, true, new_interactionprofileanalogthresholdvalve_value[value_bindingmodifications_inc]);
                            if (XR_SUCCESS != xr_result) {
                                std::string error_message = "Structure XrBindingModificationsKHR member bindingModifications";
                                error_message += "[";
                                error_message += std::to_string(value_bindingmodifications_inc);
                                error_message += "]";
                                error_message += " is invalid";
                                CoreValidLogMessage(instance_info, "VUID-XrBindingModificationsKHR-bindingModifications-parameter",
                                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                                    objects_info,
                                                    error_message);
                                return XR_ERROR_VALIDATION_FAILURE;
                                break;
                            } else {
                                continue;
                                }
                            }
                    }
                }
            }
            // Validate that the base-structure XrBindingModificationBaseHeaderKHR is valid
            if (nullptr != value->bindingModifications[value_bindingmodifications_inc]) {
                xr_result = ValidateXrStruct(instance_info, command_name,
                                                                objects_info, check_members, true, value->bindingModifications[value_bindingmodifications_inc]);
                if (XR_SUCCESS != xr_result) {
                    CoreValidLogMessage(instance_info, "VUID-XrBindingModificationsKHR-bindingModifications-parameter",
                                        VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                        objects_info,
                                        "Structure XrBindingModificationsKHR member bindingModifications is invalid");
                    return xr_result;
                }
            }
        }
    }
    // Everything checked out properly
    return xr_result;
}